

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O2

bool wasm::StackSignature::haveLeastUpperBound(StackSignature a,StackSignature b)

{
  uintptr_t uVar1;
  StackSignature self;
  StackSignature self_00;
  StackSignature other;
  StackSignature other_00;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Type *pTVar6;
  Type TVar7;
  void *in_RDI;
  size_t sVar8;
  size_t sVar9;
  uintptr_t in_stack_00000008;
  Type local_40;
  Type local_38;
  
  self.results.id = a.params.id;
  self.params.id = in_stack_00000008;
  self._16_8_ = a.results.id;
  other.results.id = b.params.id;
  other.params.id = a._16_8_;
  other._16_8_ = b.results.id;
  bVar2 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_0::operator()
                    (in_RDI,self,other);
  if ((bVar2) &&
     (self_00.results.id = b.params.id, self_00.params.id = a._16_8_, self_00._16_8_ = b.results.id,
     other_00.results.id = a.params.id, other_00.params.id = in_stack_00000008,
     other_00._16_8_ = a.results.id,
     bVar2 = haveLeastUpperBound(wasm::StackSignature,wasm::StackSignature)::$_0::operator()
                       (in_RDI,self_00,other_00), bVar2)) {
    local_40.id = in_stack_00000008;
    local_38.id = a._16_8_;
    sVar3 = wasm::Type::size(&local_38);
    sVar4 = wasm::Type::size(&local_40);
    TVar7.id = local_40.id;
    if (sVar3 < sVar4) {
      local_40.id = local_38.id;
      local_38.id = TVar7.id;
    }
    sVar3 = wasm::Type::size(&local_38);
    sVar4 = wasm::Type::size(&local_40);
    sVar5 = wasm::Type::size(&local_40);
    sVar8 = 0;
    while (sVar5 != sVar8) {
      pTVar6 = wasm::Type::operator[](&local_40,sVar8);
      uVar1 = pTVar6->id;
      pTVar6 = wasm::Type::operator[](&local_38,(sVar3 - sVar4) + sVar8);
      sVar8 = sVar8 + 1;
      if (uVar1 != pTVar6->id) {
        __assert_fail("a == b && \"TODO: calculate greatest lower bound to handle \" \"contravariance correctly\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/stack-utils.cpp"
                      ,0xd6,
                      "auto wasm::StackSignature::haveLeastUpperBound(StackSignature, StackSignature)::(anonymous class)::operator()(Type, Type) const"
                     );
      }
    }
    local_40.id = a.params.id;
    local_38.id = b.params.id;
    sVar3 = wasm::Type::size(&local_38);
    sVar4 = wasm::Type::size(&local_40);
    TVar7.id = local_40.id;
    if (sVar3 < sVar4) {
      local_40.id = local_38.id;
      local_38.id = TVar7.id;
    }
    sVar4 = wasm::Type::size(&local_38);
    sVar5 = wasm::Type::size(&local_40);
    sVar8 = wasm::Type::size(&local_40);
    sVar3 = 0;
    do {
      sVar9 = sVar8;
      if (sVar8 == sVar3) break;
      pTVar6 = wasm::Type::operator[](&local_40,sVar3);
      TVar7.id = pTVar6->id;
      pTVar6 = wasm::Type::operator[](&local_38,(sVar4 - sVar5) + sVar3);
      TVar7 = wasm::Type::getLeastUpperBound(TVar7,pTVar6->id);
      sVar9 = sVar3;
      sVar3 = sVar3 + 1;
    } while (TVar7.id != 0);
    bVar2 = sVar8 <= sVar9;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool StackSignature::haveLeastUpperBound(StackSignature a, StackSignature b) {
  // If a signature is polymorphic, the LUB could extend its params and results
  // arbitrarily. Otherwise, the LUB must extend its params and results
  // uniformly so that each additional param is a subtype of the corresponding
  // additional result.
  auto extensionCompatible = [](auto self, auto other) -> bool {
    if (self.kind == Polymorphic) {
      return true;
    }
    // If no extension, then no problem.
    if (self.params.size() >= other.params.size() &&
        self.results.size() >= other.results.size()) {
      return true;
    }
    auto extSize = other.params.size() - self.params.size();
    if (extSize != other.results.size() - self.results.size()) {
      return false;
    }
    return std::equal(other.params.begin(),
                      other.params.begin() + extSize,
                      other.results.begin(),
                      other.results.begin() + extSize,
                      [](const Type& param, const Type& result) {
                        return Type::isSubType(param, result);
                      });
  };
  if (!extensionCompatible(a, b) || !extensionCompatible(b, a)) {
    return false;
  }

  auto valsCompatible = [](auto as, auto bs, auto compatible) -> bool {
    // Canonicalize so the as are shorter and any unshared prefix is on bs.
    if (bs.size() < as.size()) {
      std::swap(as, bs);
    }
    // Check that shared values after the unshared prefix have are compatible.
    size_t diff = bs.size() - as.size();
    for (size_t i = 0, shared = as.size(); i < shared; ++i) {
      if (!compatible(as[i], bs[i + diff])) {
        return false;
      }
    }
    return true;
  };

  bool paramsOk = valsCompatible(a.params, b.params, [](Type a, Type b) {
    assert(a == b && "TODO: calculate greatest lower bound to handle "
                     "contravariance correctly");
    return true;
  });
  bool resultsOk = valsCompatible(a.results, b.results, [](Type a, Type b) {
    return Type::getLeastUpperBound(a, b) != Type::none;
  });
  return paramsOk && resultsOk;
}